

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

FT_Error skip_literal_string(FT_Byte **acur,FT_Byte *limit)

{
  byte bVar1;
  bool bVar2;
  FT_Error FVar3;
  int iVar4;
  uint uVar5;
  byte *pbVar6;
  byte *pbVar7;
  
  FVar3 = 3;
  iVar4 = 0;
  pbVar6 = *acur;
  do {
    pbVar7 = pbVar6;
    if (limit <= pbVar6) break;
    bVar1 = *pbVar6;
    pbVar7 = pbVar6 + 1;
    bVar2 = true;
    if (bVar1 == 0x28) {
      iVar4 = iVar4 + 1;
    }
    else if (bVar1 == 0x29) {
      iVar4 = iVar4 + -1;
      if (iVar4 == 0) {
        iVar4 = 0;
        FVar3 = 0;
LAB_0020cb7a:
        bVar2 = false;
      }
    }
    else if (bVar1 == 0x5c) {
      if (pbVar7 == limit) goto LAB_0020cb7a;
      uVar5 = *pbVar7 - 0x5c;
      if (((uVar5 < 0x19) && ((0x1440441U >> (uVar5 & 0x1f) & 1) != 0)) || (*pbVar7 - 0x28 < 2)) {
        pbVar7 = pbVar6 + 2;
      }
      else if (pbVar7 < limit) {
        uVar5 = 0;
        do {
          if (((*pbVar7 & 0xf8) != 0x30) || (pbVar7 = pbVar7 + 1, 1 < uVar5)) break;
          uVar5 = uVar5 + 1;
        } while (pbVar7 < limit);
      }
    }
    pbVar6 = pbVar7;
  } while (bVar2);
  *acur = pbVar7;
  return FVar3;
}

Assistant:

static FT_Error
  skip_literal_string( FT_Byte*  *acur,
                       FT_Byte*   limit )
  {
    FT_Byte*      cur   = *acur;
    FT_Int        embed = 0;
    FT_Error      error = FT_ERR( Invalid_File_Format );
    unsigned int  i;


    while ( cur < limit )
    {
      FT_Byte  c = *cur;


      cur++;

      if ( c == '\\' )
      {
        /* Red Book 3rd ed., section `Literal Text Strings', p. 29:     */
        /* A backslash can introduce three different types              */
        /* of escape sequences:                                         */
        /*   - a special escaped char like \r, \n, etc.                 */
        /*   - a one-, two-, or three-digit octal number                */
        /*   - none of the above in which case the backslash is ignored */

        if ( cur == limit )
          /* error (or to be ignored?) */
          break;

        switch ( *cur )
        {
          /* skip `special' escape */
        case 'n':
        case 'r':
        case 't':
        case 'b':
        case 'f':
        case '\\':
        case '(':
        case ')':
          cur++;
          break;

        default:
          /* skip octal escape or ignore backslash */
          for ( i = 0; i < 3 && cur < limit; i++ )
          {
            if ( !IS_OCTAL_DIGIT( *cur ) )
              break;

            cur++;
          }
        }
      }
      else if ( c == '(' )
        embed++;
      else if ( c == ')' )
      {
        embed--;
        if ( embed == 0 )
        {
          error = FT_Err_Ok;
          break;
        }
      }
    }

    *acur = cur;

    return error;
  }